

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeTiledLevel
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
              int pixel_data_size,uchar *head,size_t size,string *err)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  void *pvVar7;
  uchar **ppuVar8;
  const_reference pvVar9;
  uchar *puVar10;
  int iVar11;
  int local_cc;
  int iStack_c8;
  bool ret;
  int data_len;
  int tile_coordinates [4];
  uchar *data_ptr;
  size_t data_size;
  tinyexr_uint64 offset;
  int y_tile;
  int x_tile;
  uint uStack_84;
  bool alloc_success;
  int tile_idx;
  uint error_flag;
  int err_code;
  int num_tiles;
  int num_x_tiles;
  int num_y_tiles;
  int level_index;
  int num_channels;
  uchar *head_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_58;
  int pixel_data_size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list_local;
  OffsetData *offset_data_local;
  EXRHeader *exr_header_local;
  EXRImage *exr_image_local;
  
  num_y_tiles = exr_header->num_channels;
  _level_index = head;
  head_local._4_4_ = pixel_data_size;
  pvStack_58 = channel_offset_list;
  channel_offset_list_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)offset_data;
  offset_data_local = (OffsetData *)exr_header;
  exr_header_local = (EXRHeader *)exr_image;
  num_x_tiles = LevelIndex(exr_image->level_x,exr_image->level_y,exr_header->tile_level_mode,
                           offset_data->num_x_levels);
  pvVar4 = std::
           vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         *)channel_offset_list_local,(long)num_x_tiles);
  sVar5 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size(pvVar4);
  num_tiles = (int)sVar5;
  if (num_tiles < 1) {
    exr_image_local._4_4_ = -4;
  }
  else {
    pvVar4 = std::
             vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           *)channel_offset_list_local,(long)num_x_tiles);
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](pvVar4,0);
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar6);
    err_code = (int)sVar5;
    if (err_code < 1) {
      exr_image_local._4_4_ = -4;
    }
    else {
      error_flag = err_code * num_tiles;
      tile_idx = 0;
      uStack_84 = 0;
      pvVar7 = calloc((long)(int)error_flag,0x20);
      *(void **)exr_header_local = pvVar7;
      for (x_tile = 0; x_tile < (int)error_flag; x_tile = x_tile + 1) {
        y_tile._3_1_ = 0;
        ppuVar8 = AllocateImage(num_y_tiles,
                                (EXRChannelInfo *)
                                offset_data_local[3].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                (int *)offset_data_local[4].offsets.
                                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                offset_data_local[1].num_y_levels,
                                *(int *)&offset_data_local[2].offsets.
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                (bool *)((long)&y_tile + 3));
        *(uchar ***)(*(long *)exr_header_local + (long)x_tile * 0x20 + 0x18) = ppuVar8;
        if ((y_tile._3_1_ & 1) == 0) {
          uStack_84 = uStack_84 | 1;
        }
        else {
          iVar11 = x_tile % err_code;
          iVar3 = x_tile / err_code;
          pvVar4 = std::
                   vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                 *)channel_offset_list_local,(long)num_x_tiles);
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar4,(long)iVar3);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar6,(long)iVar11);
          vVar1 = *pvVar9;
          if (size < vVar1 + 0x14) {
            uStack_84 = uStack_84 | 2;
          }
          else {
            puVar10 = _level_index + vVar1;
            _iStack_c8 = *(undefined8 *)puVar10;
            tile_coordinates._0_8_ = *(undefined8 *)(puVar10 + 8);
            swap4(&stack0xffffffffffffff38);
            swap4(&data_len);
            swap4(tile_coordinates);
            swap4(tile_coordinates + 1);
            if (tile_coordinates[0] == (exr_header_local->data_window).max_x) {
              if (tile_coordinates[1] == (exr_header_local->data_window).max_y) {
                local_cc = *(int *)(puVar10 + 0x10);
                swap4(&local_cc);
                if ((local_cc < 2) || (size - (vVar1 + 0x14) < (ulong)(long)local_cc)) {
                  uStack_84 = uStack_84 | 2;
                }
                else {
                  bVar2 = DecodeTiledPixelData
                                    (*(uchar ***)
                                      (*(long *)exr_header_local + (long)x_tile * 0x20 + 0x18),
                                     (int *)(*(long *)exr_header_local + (long)x_tile * 0x20 + 0x10)
                                     ,(int *)(*(long *)exr_header_local + (long)x_tile * 0x20 + 0x14
                                             ),
                                     (int *)offset_data_local[4].offsets.
                                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,puVar10 + 0x14
                                     ,(long)local_cc,offset_data_local[3].num_y_levels,
                                     (exr_header_local->display_window).max_x,
                                     (exr_header_local->display_window).max_y,iStack_c8,data_len,
                                     offset_data_local[1].num_y_levels,
                                     *(int *)&offset_data_local[2].offsets.
                                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                     (long)head_local._4_4_,(long)offset_data_local[2].num_y_levels,
                                     (EXRAttribute *)
                                     offset_data_local[3].offsets.
                                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)offset_data_local[3].num_x_levels,
                                     (EXRChannelInfo *)
                                     offset_data_local[3].offsets.
                                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,pvStack_58);
                  if (!bVar2) {
                    uStack_84 = uStack_84 | 4;
                  }
                  *(int *)(*(long *)exr_header_local + (long)x_tile * 0x20) = iStack_c8;
                  *(int *)(*(long *)exr_header_local + (long)x_tile * 0x20 + 4) = data_len;
                  *(int *)(*(long *)exr_header_local + (long)x_tile * 0x20 + 8) =
                       tile_coordinates[0];
                  *(int *)(*(long *)exr_header_local + (long)x_tile * 0x20 + 0xc) =
                       tile_coordinates[1];
                }
              }
              else {
                uStack_84 = uStack_84 | 1;
              }
            }
            else {
              uStack_84 = uStack_84 | 1;
            }
          }
        }
      }
      exr_header_local->screen_window_center[0] = (float)num_y_tiles;
      exr_header_local->screen_window_center[1] = (float)error_flag;
      if (uStack_84 != 0) {
        tile_idx = -4;
      }
      if (err != (string *)0x0) {
        if ((uStack_84 & 2) != 0) {
          std::__cxx11::string::operator+=((string *)err,"Insufficient data length.\n");
        }
        if ((uStack_84 & 4) != 0) {
          std::__cxx11::string::operator+=((string *)err,"Failed to decode tile data.\n");
        }
      }
      exr_image_local._4_4_ = tile_idx;
    }
  }
  return exr_image_local._4_4_;
}

Assistant:

static int DecodeTiledLevel(EXRImage* exr_image, const EXRHeader* exr_header,
  const OffsetData& offset_data,
  const std::vector<size_t>& channel_offset_list,
  int pixel_data_size,
  const unsigned char* head, const size_t size,
  std::string* err) {
  int num_channels = exr_header->num_channels;

  int level_index = LevelIndex(exr_image->level_x, exr_image->level_y, exr_header->tile_level_mode, offset_data.num_x_levels);
  int num_y_tiles = int(offset_data.offsets[size_t(level_index)].size());
  if (num_y_tiles < 1) {
    return TINYEXR_ERROR_INVALID_DATA;
  }
  int num_x_tiles = int(offset_data.offsets[size_t(level_index)][0].size());
  if (num_x_tiles < 1) {
    return TINYEXR_ERROR_INVALID_DATA;
  }
  int num_tiles = num_x_tiles * num_y_tiles;

  int err_code = TINYEXR_SUCCESS;

  enum {
    EF_SUCCESS = 0,
    EF_INVALID_DATA = 1,
    EF_INSUFFICIENT_DATA = 2,
    EF_FAILED_TO_DECODE = 4
  };
#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<unsigned> error_flag(EF_SUCCESS);
#else
  unsigned error_flag(EF_SUCCESS);
#endif

  // Although the spec says : "...the data window is subdivided into an array of smaller rectangles...",
  // the IlmImf library allows the dimensions of the tile to be larger (or equal) than the dimensions of the data window.
#if 0
  if ((exr_header->tile_size_x > exr_image->width || exr_header->tile_size_y > exr_image->height) &&
    exr_image->level_x == 0 && exr_image->level_y == 0) {
    if (err) {
      (*err) += "Failed to decode tile data.\n";
    }
    err_code = TINYEXR_ERROR_INVALID_DATA;
  }
#endif
  exr_image->tiles = static_cast<EXRTile*>(
    calloc(static_cast<size_t>(num_tiles), sizeof(EXRTile)));

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::vector<std::thread> workers;
  std::atomic<int> tile_count(0);

  int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
#if (TINYEXR_MAX_THREADS > 0)
  num_threads = std::min(num_threads,TINYEXR_MAX_THREADS);
#endif
  if (num_threads > int(num_tiles)) {
    num_threads = int(num_tiles);
  }
  for (int t = 0; t < num_threads; t++) {
    workers.emplace_back(std::thread([&]()
      {
        int tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
  for (int tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
    // Allocate memory for each tile.
    bool alloc_success = false;
    exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
      num_channels, exr_header->channels,
      exr_header->requested_pixel_types, exr_header->tile_size_x,
      exr_header->tile_size_y, &alloc_success);

    if (!alloc_success) {
      error_flag |= EF_INVALID_DATA;
      continue;
    }

    int x_tile = tile_idx % num_x_tiles;
    int y_tile = tile_idx / num_x_tiles;
    // 16 byte: tile coordinates
    // 4 byte : data size
    // ~      : data(uncompressed or compressed)
    tinyexr::tinyexr_uint64 offset = offset_data.offsets[size_t(level_index)][size_t(y_tile)][size_t(x_tile)];
    if (offset + sizeof(int) * 5 > size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA;
      continue;
    }

    size_t data_size =
      size_t(size - (offset + sizeof(int) * 5));
    const unsigned char* data_ptr =
      reinterpret_cast<const unsigned char*>(head + offset);

    int tile_coordinates[4];
    memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
    tinyexr::swap4(&tile_coordinates[0]);
    tinyexr::swap4(&tile_coordinates[1]);
    tinyexr::swap4(&tile_coordinates[2]);
    tinyexr::swap4(&tile_coordinates[3]);

    if (tile_coordinates[2] != exr_image->level_x) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }
    if (tile_coordinates[3] != exr_image->level_y) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }

    int data_len;
    memcpy(&data_len, data_ptr + 16,
      sizeof(int));  // 16 = sizeof(tile_coordinates)
    tinyexr::swap4(&data_len);

    if (data_len < 2 || size_t(data_len) > data_size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA;
      continue;
    }

    // Move to data addr: 20 = 16 + 4;
    data_ptr += 20;
    bool ret = tinyexr::DecodeTiledPixelData(
      exr_image->tiles[tile_idx].images,
      &(exr_image->tiles[tile_idx].width),
      &(exr_image->tiles[tile_idx].height),
      exr_header->requested_pixel_types, data_ptr,
      static_cast<size_t>(data_len), exr_header->compression_type,
      exr_image->width, exr_image->height,
      tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
      exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
      static_cast<size_t>(exr_header->num_custom_attributes),
      exr_header->custom_attributes,
      static_cast<size_t>(exr_header->num_channels),
      exr_header->channels, channel_offset_list);

    if (!ret) {
      // Failed to decode tile data.
      error_flag |= EF_FAILED_TO_DECODE;
    }

    exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
    exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
    exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
    exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  }
        }));
    }  // num_thread loop

    for (auto& t : workers) {
      t.join();
    }

#else
  } // parallel for
#endif

  // Even in the event of an error, the reserved memory may be freed.
  exr_image->num_channels = num_channels;
  exr_image->num_tiles = static_cast<int>(num_tiles);

  if (error_flag)  err_code = TINYEXR_ERROR_INVALID_DATA;
  if (err) {
    if (error_flag & EF_INSUFFICIENT_DATA) {
      (*err) += "Insufficient data length.\n";
    }
    if (error_flag & EF_FAILED_TO_DECODE) {
      (*err) += "Failed to decode tile data.\n";
    }
  }
  return err_code;
}